

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generation_iterator.cpp
# Opt level: O0

generation_iterator * __thiscall pstore::generation_iterator::operator++(generation_iterator *this)

{
  element_type *peVar1;
  generation_iterator *local_10;
  generation_iterator *this_local;
  
  local_10 = this;
  database::getro<pstore::trailer,void>
            ((database *)&stack0xffffffffffffffe0,(typed_address<pstore::trailer>)this->db_);
  peVar1 = std::__shared_ptr_access<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&stack0xffffffffffffffe0);
  (this->pos_).a_.a_ = (peVar1->a).prev_generation.a_.a_;
  std::shared_ptr<const_pstore::trailer>::~shared_ptr
            ((shared_ptr<const_pstore::trailer> *)&stack0xffffffffffffffe0);
  validate(this);
  return this;
}

Assistant:

generation_iterator & generation_iterator::operator++ () {
        pos_ = db_->getro<pstore::trailer> (pos_)->a.prev_generation;
        this->validate ();
        return *this;
    }